

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

positionTy * __thiscall positionTy::deg2rad(positionTy *this)

{
  double *pdVar1;
  positionTy *in_RDI;
  double dVar2;
  
  if ((SUB21(in_RDI->f,1) >> 3 & 1) == 0) {
    pdVar1 = lat(in_RDI);
    dVar2 = ::deg2rad(*pdVar1);
    pdVar1 = lat(in_RDI);
    *pdVar1 = dVar2;
    pdVar1 = lon(in_RDI);
    dVar2 = ::deg2rad(*pdVar1);
    pdVar1 = lon(in_RDI);
    *pdVar1 = dVar2;
    in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xf7ff | 0x800);
  }
  return in_RDI;
}

Assistant:

positionTy& positionTy::deg2rad()
{
    if (f.unitAngle == UNIT_DEG) {          // if DEG convert to RAD
        lat() = ::deg2rad(lat());
        lon() = ::deg2rad(lon());
        f.unitAngle = UNIT_RAD;
    }
    return *this;
}